

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::
basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::visit_bool(basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             *this,bool value,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  pointer peVar2;
  container_type *pcVar3;
  char *pcVar4;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->stack_).
        super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
        ._M_impl.super__Vector_impl_data._M_start != peVar2) && (peVar2[-1].type_ == array)) &&
     (peVar2[-1].count_ != 0)) {
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
  }
  pcVar3 = (this->sink_).buf_ptr;
  if (value) {
    pcVar4 = "truefalse";
  }
  else {
    pcVar4 = "false";
  }
  std::__cxx11::string::replace((ulong)pcVar3,pcVar3->_M_string_length,(char *)0x0,(ulong)pcVar4);
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    psVar1 = &peVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_bool(bool value, semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            if (value)
            {
                sink_.append(true_constant().data(), true_constant().size());
            }
            else
            {
                sink_.append(false_constant().data(), false_constant().size());
            }

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }